

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScaleProcess.cpp
# Opt level: O1

void __thiscall Assimp::ScaleProcess::Execute(ScaleProcess *this,aiScene *pScene)

{
  aiAnimation *paVar1;
  aiNodeAnim *paVar2;
  aiVectorKey *paVar3;
  aiMesh *paVar4;
  aiVector3D *paVar5;
  aiAnimMesh *paVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  aiVector3D scale;
  aiVector3D pos;
  aiQuaternion rotation;
  aiVector3t<float> local_70;
  aiVector3t<float> local_64;
  aiQuaterniont<float> local_58;
  aiScene *local_48;
  ulong local_40;
  aiBone *local_38;
  
  fVar12 = this->mScale;
  if ((fVar12 != 1.0) || (NAN(fVar12))) {
    if ((fVar12 == 0.0) && (!NAN(fVar12))) {
      __assert_fail("mScale != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ScaleProcess.cpp"
                    ,0x58,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
    }
    if (pScene == (aiScene *)0x0) {
      __assert_fail("nullptr != pScene",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ScaleProcess.cpp"
                    ,0x59,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
    }
    if (pScene->mRootNode == (aiNode *)0x0) {
      __assert_fail("nullptr != pScene->mRootNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ScaleProcess.cpp"
                    ,0x5a,"virtual void Assimp::ScaleProcess::Execute(aiScene *)");
    }
    if (pScene->mNumAnimations != 0) {
      uVar7 = 0;
      do {
        paVar1 = pScene->mAnimations[uVar7];
        if (paVar1->mNumChannels != 0) {
          uVar8 = 0;
          do {
            paVar2 = paVar1->mChannels[uVar8];
            if (paVar2->mNumPositionKeys != 0) {
              lVar9 = 0x10;
              uVar10 = 0;
              do {
                paVar3 = paVar2->mPositionKeys;
                fVar12 = this->mScale;
                *(float *)((long)paVar3 + lVar9 + -8) =
                     *(float *)((long)paVar3 + lVar9 + -8) * fVar12;
                *(float *)((long)paVar3 + lVar9 + -4) =
                     *(float *)((long)paVar3 + lVar9 + -4) * fVar12;
                *(float *)((long)&paVar3->mTime + lVar9) =
                     fVar12 * *(float *)((long)&paVar3->mTime + lVar9);
                uVar10 = uVar10 + 1;
                lVar9 = lVar9 + 0x18;
              } while (uVar10 < paVar2->mNumPositionKeys);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < paVar1->mNumChannels);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < pScene->mNumAnimations);
    }
    if (pScene->mNumMeshes != 0) {
      uVar7 = 0;
      local_48 = pScene;
      do {
        paVar4 = local_48->mMeshes[uVar7];
        if (paVar4->mNumVertices != 0) {
          lVar9 = 8;
          uVar8 = 0;
          do {
            paVar5 = paVar4->mVertices;
            fVar12 = this->mScale;
            *(float *)((long)paVar5 + lVar9 + -8) = *(float *)((long)paVar5 + lVar9 + -8) * fVar12;
            *(float *)((long)paVar5 + lVar9 + -4) = *(float *)((long)paVar5 + lVar9 + -4) * fVar12;
            *(float *)((long)&paVar5->x + lVar9) = fVar12 * *(float *)((long)&paVar5->x + lVar9);
            uVar8 = uVar8 + 1;
            lVar9 = lVar9 + 0xc;
          } while (uVar8 < paVar4->mNumVertices);
        }
        local_40 = uVar7;
        if (paVar4->mNumBones != 0) {
          uVar7 = 0;
          do {
            local_38 = paVar4->mBones[uVar7];
            local_64.x = 0.0;
            local_64.y = 0.0;
            local_64.z = 0.0;
            local_70.x = 0.0;
            local_70.y = 0.0;
            local_70.z = 0.0;
            local_58.w = 1.0;
            local_58.x = 0.0;
            local_58.y = 0.0;
            local_58.z = 0.0;
            aiMatrix4x4t<float>::Decompose(&local_38->mOffsetMatrix,&local_70,&local_58,&local_64);
            fVar12 = this->mScale;
            fVar37 = local_58.y * local_58.y + local_58.z * local_58.z;
            fVar15 = local_58.x * local_58.y - local_58.z * local_58.w;
            fVar18 = local_58.x * local_58.z + local_58.y * local_58.w;
            fVar41 = local_58.z * local_58.w + local_58.x * local_58.y;
            fVar15 = fVar15 + fVar15;
            fVar35 = local_58.z * local_58.z + local_58.x * local_58.x;
            fVar18 = fVar18 + fVar18;
            fVar22 = local_58.y * local_58.z - local_58.x * local_58.w;
            fVar41 = fVar41 + fVar41;
            fVar22 = fVar22 + fVar22;
            fVar13 = local_58.x * local_58.z - local_58.y * local_58.w;
            fVar13 = fVar13 + fVar13;
            fVar30 = 1.0 - (fVar37 + fVar37);
            fVar25 = local_58.x * local_58.w + local_58.y * local_58.z;
            fVar25 = fVar25 + fVar25;
            fVar37 = local_58.x * local_58.x + local_58.y * local_58.y;
            fVar11 = 1.0 - (fVar35 + fVar35);
            fVar37 = 1.0 - (fVar37 + fVar37);
            fVar35 = fVar41 * 0.0;
            fVar19 = fVar13 * 0.0;
            fVar38 = local_64.x * fVar12 * 0.0;
            fVar28 = fVar11 * 0.0;
            fVar31 = fVar30 * 0.0;
            fVar32 = fVar31 + fVar35;
            fVar27 = fVar30 + fVar35 + fVar19 + fVar38;
            fVar42 = fVar25 * 0.0;
            fVar29 = fVar22 * 0.0;
            fVar40 = fVar37 * 0.0;
            fVar16 = fVar18 + fVar29 + fVar40 + fVar38;
            fVar38 = fVar28 + fVar15 + fVar42 + fVar38;
            fVar15 = fVar15 * 0.0;
            fVar28 = fVar15 + fVar28;
            fVar18 = fVar18 * 0.0;
            fVar29 = fVar18 + fVar29;
            fVar35 = local_64.y * fVar12 * 0.0;
            fVar30 = fVar41 + fVar31 + fVar19 + fVar35;
            fVar23 = fVar22 + fVar18 + fVar40 + fVar35;
            fVar35 = fVar11 + fVar15 + fVar42 + fVar35;
            fVar11 = fVar12 * local_64.z * 0.0;
            fVar39 = fVar13 + fVar32 + fVar11;
            fVar41 = fVar37 + fVar29 + fVar11;
            fVar11 = fVar25 + fVar28 + fVar11;
            fVar36 = fVar38 * 0.0;
            fVar37 = fVar27 * 0.0;
            fVar15 = fVar37 + fVar36;
            fVar17 = fVar16 * 0.0;
            fVar14 = fVar35 * 0.0;
            fVar13 = fVar30 * 0.0;
            fVar18 = fVar13 + fVar14;
            fVar24 = fVar23 * 0.0;
            fVar26 = fVar11 * 0.0;
            fVar20 = fVar39 * 0.0;
            fVar21 = fVar20 + fVar26;
            fVar22 = fVar41 * 0.0;
            fVar33 = fVar32 + fVar19 + 0.0;
            fVar28 = fVar28 + fVar42 + 0.0;
            fVar19 = fVar28 * 0.0;
            fVar42 = fVar33 * 0.0;
            fVar34 = fVar42 + fVar19;
            fVar25 = local_64.x * fVar12 + 0.0;
            fVar31 = fVar25 * 0.0;
            fVar29 = fVar29 + fVar40 + 0.0;
            fVar32 = fVar29 * 0.0;
            (local_38->mOffsetMatrix).a1 = local_70.x * fVar27 + fVar36 + fVar17 + fVar31;
            (local_38->mOffsetMatrix).a2 = local_70.y * fVar38 + fVar37 + fVar17 + fVar31;
            fVar37 = local_64.y * fVar12 + 0.0;
            fVar27 = fVar37 * 0.0;
            (local_38->mOffsetMatrix).a3 = local_70.z * fVar16 + fVar15 + fVar31;
            fVar12 = fVar12 * local_64.z + 0.0;
            fVar31 = fVar12 * 0.0;
            (local_38->mOffsetMatrix).a4 = fVar15 + fVar17 + fVar25;
            (local_38->mOffsetMatrix).b1 = local_70.x * fVar30 + fVar14 + fVar24 + fVar27;
            (local_38->mOffsetMatrix).b2 = local_70.y * fVar35 + fVar13 + fVar24 + fVar27;
            (local_38->mOffsetMatrix).b3 = local_70.z * fVar23 + fVar18 + fVar27;
            (local_38->mOffsetMatrix).b4 = fVar18 + fVar24 + fVar37;
            (local_38->mOffsetMatrix).c1 = local_70.x * fVar39 + fVar26 + fVar22 + fVar31;
            (local_38->mOffsetMatrix).c2 = local_70.y * fVar11 + fVar20 + fVar22 + fVar31;
            (local_38->mOffsetMatrix).c3 = local_70.z * fVar41 + fVar21 + fVar31;
            (local_38->mOffsetMatrix).c4 = fVar21 + fVar22 + fVar12;
            (local_38->mOffsetMatrix).d1 = local_70.x * fVar33 + fVar19 + fVar32 + 0.0;
            (local_38->mOffsetMatrix).d2 = local_70.y * fVar28 + fVar42 + fVar32 + 0.0;
            (local_38->mOffsetMatrix).d3 = local_70.z * fVar29 + fVar34 + 0.0;
            (local_38->mOffsetMatrix).d4 = fVar34 + fVar32 + 1.0;
            uVar7 = uVar7 + 1;
          } while (uVar7 < paVar4->mNumBones);
        }
        if (paVar4->mNumAnimMeshes != 0) {
          uVar7 = 0;
          do {
            paVar6 = paVar4->mAnimMeshes[uVar7];
            if (paVar6->mNumVertices != 0) {
              lVar9 = 8;
              uVar8 = 0;
              do {
                paVar5 = paVar6->mVertices;
                fVar12 = this->mScale;
                *(float *)((long)paVar5 + lVar9 + -8) =
                     *(float *)((long)paVar5 + lVar9 + -8) * fVar12;
                *(float *)((long)paVar5 + lVar9 + -4) =
                     *(float *)((long)paVar5 + lVar9 + -4) * fVar12;
                *(float *)((long)&paVar5->x + lVar9) = fVar12 * *(float *)((long)&paVar5->x + lVar9)
                ;
                uVar8 = uVar8 + 1;
                lVar9 = lVar9 + 0xc;
              } while (uVar8 < paVar6->mNumVertices);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < paVar4->mNumAnimMeshes);
        }
        uVar7 = local_40 + 1;
        pScene = local_48;
      } while (uVar7 < local_48->mNumMeshes);
    }
    traverseNodes(this,pScene->mRootNode,0);
  }
  return;
}

Assistant:

void ScaleProcess::Execute( aiScene* pScene ) {
    if(mScale == 1.0f)  {
        return; // nothing to scale
    }
    
    ai_assert( mScale != 0 );
    ai_assert( nullptr != pScene );
    ai_assert( nullptr != pScene->mRootNode );

    if ( nullptr == pScene ) {
        return;
    }

    if ( nullptr == pScene->mRootNode ) {
        return;
    }
    
    // Process animations and update position transform to new unit system
    for( unsigned int animationID = 0; animationID < pScene->mNumAnimations; animationID++ )
    {
        aiAnimation* animation = pScene->mAnimations[animationID];

        for( unsigned int animationChannel = 0; animationChannel < animation->mNumChannels; animationChannel++)
        {
            aiNodeAnim* anim = animation->mChannels[animationChannel];
            
            for( unsigned int posKey = 0; posKey < anim->mNumPositionKeys; posKey++)
            {
                aiVectorKey& vectorKey = anim->mPositionKeys[posKey];
                vectorKey.mValue *= mScale;
            }
        }
    }

    for( unsigned int meshID = 0; meshID < pScene->mNumMeshes; meshID++)
    {
        aiMesh *mesh = pScene->mMeshes[meshID]; 
        
        // Reconstruct mesh vertexes to the new unit system
        for( unsigned int vertexID = 0; vertexID < mesh->mNumVertices; vertexID++)
        {
            aiVector3D& vertex = mesh->mVertices[vertexID];
            vertex *= mScale;
        }


        // bone placement / scaling
        for( unsigned int boneID = 0; boneID < mesh->mNumBones; boneID++)
        {
            // Reconstruct matrix by transform rather than by scale 
            // This prevent scale values being changed which can
            // be meaningful in some cases 
            // like when you want the modeller to see 1:1 compatibility.
            aiBone* bone = mesh->mBones[boneID];

            aiVector3D pos, scale;
            aiQuaternion rotation;

            bone->mOffsetMatrix.Decompose( scale, rotation, pos);
            
            aiMatrix4x4 translation;
            aiMatrix4x4::Translation( pos * mScale, translation );
            
            aiMatrix4x4 scaling;
            aiMatrix4x4::Scaling( aiVector3D(scale), scaling );

            aiMatrix4x4 RotMatrix = aiMatrix4x4 (rotation.GetMatrix());

            bone->mOffsetMatrix = translation * RotMatrix * scaling;
        }


        // animation mesh processing
        // convert by position rather than scale.
        for( unsigned int animMeshID = 0; animMeshID < mesh->mNumAnimMeshes; animMeshID++)
        {
            aiAnimMesh * animMesh = mesh->mAnimMeshes[animMeshID];
            
            for( unsigned int vertexID = 0; vertexID < animMesh->mNumVertices; vertexID++)
            {
                aiVector3D& vertex = animMesh->mVertices[vertexID];
                vertex *= mScale;
            }
        }
    }

    traverseNodes( pScene->mRootNode );
}